

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr,XML_Bool haveMore)

{
  XML_Parsing XVar1;
  TAG *pTVar2;
  XML_CharacterDataHandler p_Var3;
  void *pvVar4;
  XML_Error XVar5;
  int iVar6;
  char *ptr;
  STRING_POOL *pool;
  char *pcVar7;
  XML_Char *pXStack_170;
  XML_Convert_Result convert_res_1;
  ICHAR *dataPtr_1;
  XML_CharacterDataHandler charDataHandler;
  ICHAR *dataPtr;
  XML_Error result_3;
  int iStack_14c;
  XML_Char c_1;
  XML_Char buf [4];
  int n;
  BINDING *b;
  XML_Char *uri;
  XML_Char *prefix;
  XML_Char *localPart;
  TAG *tag_1;
  char *rawName_1;
  undefined1 auStack_110 [4];
  int len;
  TAG_NAME name_1;
  BINDING *pBStack_e0;
  XML_Bool noElmHandlers;
  BINDING *bindings;
  char *pcStack_d0;
  XML_Error result_2;
  char *rawName;
  char *temp;
  int local_b8;
  XML_Convert_Result convert_res;
  int convLen;
  int bufSize;
  char *fromPtr;
  char *rawNameEnd;
  XML_Char *toPtr;
  TAG *pTStack_90;
  XML_Error result_1;
  TAG *tag;
  XML_Char *context;
  XML_Error result;
  XML_Char ch;
  ENTITY *entity;
  XML_Char *name;
  XML_Char c;
  NAMED **ppNStack_60;
  int tok;
  char *next;
  char **eventEndPP;
  char **eventPP;
  DTD *dtd;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  ENCODING *enc_local;
  XML_Parser pXStack_18;
  int startTagLevel_local;
  XML_Parser parser_local;
  
  eventPP = (char **)parser->m_dtd;
  if (enc == parser->m_encoding) {
    eventEndPP = &parser->m_eventPtr;
    next = (char *)&parser->m_eventEndPtr;
  }
  else {
    eventEndPP = &parser->m_openInternalEntities->internalEventPtr;
    next = (char *)&parser->m_openInternalEntities->internalEventEndPtr;
  }
  *eventEndPP = s;
  dtd = (DTD *)nextPtr;
  nextPtr_local = (char **)end;
  end_local = s;
  s_local = (char *)enc;
  enc_local._4_4_ = startTagLevel;
  pXStack_18 = parser;
  do {
    ppNStack_60 = (NAMED **)end_local;
    name._4_4_ = (**(code **)(s_local + 8))
                           (s_local,end_local,nextPtr_local,&stack0xffffffffffffffa0);
    pcVar7 = s_local;
    *(NAMED ***)next = ppNStack_60;
    switch(name._4_4_) {
    case 0:
      *eventEndPP = (char *)ppNStack_60;
      return XML_ERROR_INVALID_TOKEN;
    case 1:
    case 2:
      if (pXStack_18->m_freeTagList == (TAG *)0x0) {
        pTStack_90 = (TAG *)(*(pXStack_18->m_mem).malloc_fcn)(0x58);
        if (pTStack_90 == (TAG *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar7 = (char *)(*(pXStack_18->m_mem).malloc_fcn)(0x20);
        pTStack_90->buf = pcVar7;
        if (pTStack_90->buf == (char *)0x0) {
          (*(pXStack_18->m_mem).free_fcn)(pTStack_90);
          return XML_ERROR_NO_MEMORY;
        }
        pTStack_90->bufEnd = pTStack_90->buf + 0x20;
      }
      else {
        pTStack_90 = pXStack_18->m_freeTagList;
        pXStack_18->m_freeTagList = pXStack_18->m_freeTagList->parent;
      }
      pTStack_90->bindings = (BINDING *)0x0;
      pTStack_90->parent = pXStack_18->m_tagStack;
      pXStack_18->m_tagStack = pTStack_90;
      (pTStack_90->name).localPart = (XML_Char *)0x0;
      (pTStack_90->name).prefix = (XML_Char *)0x0;
      pTStack_90->rawName = end_local + *(int *)(s_local + 0x78);
      iVar6 = (**(code **)(s_local + 0x30))(s_local,pTStack_90->rawName);
      pTStack_90->rawNameLength = iVar6;
      pXStack_18->m_tagLevel = pXStack_18->m_tagLevel + 1;
      fromPtr = pTStack_90->rawName + pTStack_90->rawNameLength;
      _convLen = pTStack_90->rawName;
      rawNameEnd = pTStack_90->buf;
      while( true ) {
        temp._4_4_ = (**(code **)(s_local + 0x68))
                               (s_local,&convLen,fromPtr,&rawNameEnd,pTStack_90->bufEnd + -1);
        local_b8 = (int)rawNameEnd - (int)pTStack_90->buf;
        if ((fromPtr <= _convLen) || (temp._4_4_ == 1)) break;
        convert_res = ((int)pTStack_90->bufEnd - (int)pTStack_90->buf) * 2;
        rawName = (char *)(*(pXStack_18->m_mem).realloc_fcn)(pTStack_90->buf,(long)(int)convert_res)
        ;
        if (rawName == (char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pTStack_90->buf = rawName;
        pTStack_90->bufEnd = rawName + (int)convert_res;
        rawNameEnd = rawName + local_b8;
      }
      (pTStack_90->name).strLen = local_b8;
      (pTStack_90->name).str = pTStack_90->buf;
      *rawNameEnd = '\0';
      toPtr._4_4_ = storeAtts(pXStack_18,(ENCODING *)s_local,end_local,&pTStack_90->name,
                              &pTStack_90->bindings);
      if (toPtr._4_4_ != XML_ERROR_NONE) {
        return toPtr._4_4_;
      }
      if (pXStack_18->m_startElementHandler == (XML_StartElementHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
        }
      }
      else {
        (*pXStack_18->m_startElementHandler)
                  (pXStack_18->m_handlerArg,(pTStack_90->name).str,&pXStack_18->m_atts->name);
      }
      poolClear(&pXStack_18->m_tempPool);
      break;
    case 3:
    case 4:
      ptr = end_local + *(int *)(s_local + 0x78);
      pBStack_e0 = (BINDING *)0x0;
      name_1._39_1_ = 1;
      pool = &pXStack_18->m_tempPool;
      pcStack_d0 = ptr;
      iVar6 = (**(code **)(s_local + 0x30))(s_local,ptr);
      _auStack_110 = poolStoreString(pool,(ENCODING *)pcVar7,ptr,ptr + iVar6);
      if (_auStack_110 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      (pXStack_18->m_tempPool).start = (pXStack_18->m_tempPool).ptr;
      bindings._4_4_ =
           storeAtts(pXStack_18,(ENCODING *)s_local,end_local,(TAG_NAME *)auStack_110,
                     &stack0xffffffffffffff20);
      if (bindings._4_4_ != XML_ERROR_NONE) {
        freeBindings(pXStack_18,pBStack_e0);
        return bindings._4_4_;
      }
      (pXStack_18->m_tempPool).start = (pXStack_18->m_tempPool).ptr;
      if (pXStack_18->m_startElementHandler != (XML_StartElementHandler)0x0) {
        (*pXStack_18->m_startElementHandler)
                  (pXStack_18->m_handlerArg,_auStack_110,&pXStack_18->m_atts->name);
        name_1._39_1_ = 0;
      }
      if (pXStack_18->m_endElementHandler != (XML_EndElementHandler)0x0) {
        if (pXStack_18->m_startElementHandler != (XML_StartElementHandler)0x0) {
          *eventEndPP = *(char **)next;
        }
        (*pXStack_18->m_endElementHandler)(pXStack_18->m_handlerArg,_auStack_110);
        name_1._39_1_ = 0;
      }
      if ((name_1._39_1_ != '\0') && (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0)) {
        reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
      }
      poolClear(&pXStack_18->m_tempPool);
      freeBindings(pXStack_18,pBStack_e0);
      if ((pXStack_18->m_tagLevel == 0) && ((pXStack_18->m_parsingStatus).parsing != XML_FINISHED))
      {
        if ((pXStack_18->m_parsingStatus).parsing != XML_SUSPENDED) {
          XVar5 = epilogProcessor(pXStack_18,(char *)ppNStack_60,(char *)nextPtr_local,(char **)dtd)
          ;
          return XVar5;
        }
        pXStack_18->m_processor = epilogProcessor;
      }
      break;
    case 5:
      if (pXStack_18->m_tagLevel == enc_local._4_4_) {
        return XML_ERROR_ASYNC_ENTITY;
      }
      pTVar2 = pXStack_18->m_tagStack;
      pXStack_18->m_tagStack = pTVar2->parent;
      pTVar2->parent = pXStack_18->m_freeTagList;
      pXStack_18->m_freeTagList = pTVar2;
      pcVar7 = end_local + (*(int *)(s_local + 0x78) << 1);
      iVar6 = (**(code **)(s_local + 0x30))(s_local,pcVar7);
      if ((iVar6 != pTVar2->rawNameLength) ||
         (iVar6 = memcmp(pTVar2->rawName,pcVar7,(long)iVar6), iVar6 != 0)) {
        *eventEndPP = pcVar7;
        return XML_ERROR_TAG_MISMATCH;
      }
      pXStack_18->m_tagLevel = pXStack_18->m_tagLevel + -1;
      if (pXStack_18->m_endElementHandler == (XML_EndElementHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
        }
      }
      else {
        prefix = (pTVar2->name).localPart;
        if ((pXStack_18->m_ns != '\0') && (prefix != (XML_Char *)0x0)) {
          b = (BINDING *)((pTVar2->name).str + (pTVar2->name).uriLen);
          while (*prefix != '\0') {
            *(XML_Char *)&b->prefix = *prefix;
            b = (BINDING *)((long)&b->prefix + 1);
            prefix = prefix + 1;
          }
          uri = (pTVar2->name).prefix;
          if ((pXStack_18->m_ns_triplets != '\0') && (uri != (XML_Char *)0x0)) {
            *(XML_Char *)&b->prefix = pXStack_18->m_namespaceSeparator;
            while (b = (BINDING *)((long)&b->prefix + 1), *uri != '\0') {
              *(XML_Char *)&b->prefix = *uri;
              uri = uri + 1;
            }
          }
          *(undefined1 *)&b->prefix = 0;
        }
        (*pXStack_18->m_endElementHandler)(pXStack_18->m_handlerArg,(pTVar2->name).str);
      }
      while (pTVar2->bindings != (BINDING *)0x0) {
        _buf = pTVar2->bindings;
        if (pXStack_18->m_endNamespaceDeclHandler != (XML_EndNamespaceDeclHandler)0x0) {
          (*pXStack_18->m_endNamespaceDeclHandler)(pXStack_18->m_handlerArg,_buf->prefix->name);
        }
        pTVar2->bindings = pTVar2->bindings->nextTagBinding;
        _buf->nextTagBinding = pXStack_18->m_freeBindingList;
        pXStack_18->m_freeBindingList = _buf;
        _buf->prefix->binding = _buf->prevPrefixBinding;
      }
      if (pXStack_18->m_tagLevel == 0) {
        XVar5 = epilogProcessor(pXStack_18,(char *)ppNStack_60,(char *)nextPtr_local,(char **)dtd);
        return XVar5;
      }
      break;
    case 6:
      dataPtr_1 = (ICHAR *)pXStack_18->m_characterDataHandler;
      if ((XML_CharacterDataHandler)dataPtr_1 == (XML_CharacterDataHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
        }
      }
      else if (s_local[0x7c] == '\0') {
        while( true ) {
          pXStack_170 = pXStack_18->m_dataBuf;
          iVar6 = (**(code **)(s_local + 0x68))
                            (s_local,&end_local,ppNStack_60,&stack0xfffffffffffffe90,
                             pXStack_18->m_dataBufEnd);
          *(char **)next = end_local;
          (*(code *)dataPtr_1)
                    (pXStack_18->m_handlerArg,pXStack_18->m_dataBuf,
                     (long)pXStack_170 - (long)pXStack_18->m_dataBuf & 0xffffffff);
          if ((iVar6 == 0) || (iVar6 == 1)) break;
          *eventEndPP = end_local;
        }
      }
      else {
        (*(code *)dataPtr_1)(pXStack_18->m_handlerArg,end_local,(int)ppNStack_60 - (int)end_local);
      }
      break;
    case 7:
      if (pXStack_18->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
        }
      }
      else {
        dataPtr._7_1_ = 10;
        (*pXStack_18->m_characterDataHandler)
                  (pXStack_18->m_handlerArg,(XML_Char *)((long)&dataPtr + 7),1);
      }
      break;
    case 8:
      if (pXStack_18->m_startCdataSectionHandler == (XML_StartCdataSectionHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
        }
      }
      else {
        (*pXStack_18->m_startCdataSectionHandler)(pXStack_18->m_handlerArg);
      }
      XVar5 = doCdataSection(pXStack_18,(ENCODING *)s_local,(char **)&stack0xffffffffffffffa0,
                             (char *)nextPtr_local,(char **)dtd,haveMore);
      if (XVar5 != XML_ERROR_NONE) {
        return XVar5;
      }
      if (ppNStack_60 == (NAMED **)0x0) {
        pXStack_18->m_processor = cdataSectionProcessor;
        return XML_ERROR_NONE;
      }
      dataPtr._0_4_ = 0;
      break;
    case 9:
      context._7_1_ =
           (**(code **)(s_local + 0x50))
                     (s_local,end_local + *(int *)(s_local + 0x78),
                      (long)ppNStack_60 - (long)*(int *)(s_local + 0x78));
      if (context._7_1_ == '\0') {
        entity = (ENTITY *)
                 poolStoreString((STRING_POOL *)(eventPP + 0x14),(ENCODING *)s_local,
                                 end_local + *(int *)(s_local + 0x78),
                                 (char *)((long)ppNStack_60 - (long)*(int *)(s_local + 0x78)));
        if (entity == (ENTITY *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        _result = (ENTITY *)lookup(pXStack_18,(HASH_TABLE *)eventPP,(KEY)entity,0);
        eventPP[0x17] = eventPP[0x18];
        if ((*(char *)((long)eventPP + 0x101) == '\0') || (*(char *)((long)eventPP + 0x102) != '\0')
           ) {
          if (_result == (ENTITY *)0x0) {
            return XML_ERROR_UNDEFINED_ENTITY;
          }
          if (_result->is_internal == '\0') {
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
          }
        }
        else if (_result == (ENTITY *)0x0) {
          if (pXStack_18->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) {
            if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
              reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
            }
          }
          else {
            (*pXStack_18->m_skippedEntityHandler)(pXStack_18->m_handlerArg,(XML_Char *)entity,0);
          }
          break;
        }
        if (_result->open != '\0') {
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (_result->notation != (XML_Char *)0x0) {
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (_result->textPtr == (XML_Char *)0x0) {
          if (pXStack_18->m_externalEntityRefHandler == (XML_ExternalEntityRefHandler)0x0) {
            if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
              reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
            }
          }
          else {
            _result->open = '\x01';
            tag = (TAG *)getContext(pXStack_18);
            _result->open = '\0';
            if (tag == (TAG *)0x0) {
              return XML_ERROR_NO_MEMORY;
            }
            iVar6 = (*pXStack_18->m_externalEntityRefHandler)
                              (pXStack_18->m_externalEntityRefHandlerArg,(XML_Char *)tag,
                               _result->base,_result->systemId,_result->publicId);
            if (iVar6 == 0) {
              return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
            }
            (pXStack_18->m_tempPool).ptr = (pXStack_18->m_tempPool).start;
          }
        }
        else if (pXStack_18->m_defaultExpandInternalEntities == '\0') {
          if (pXStack_18->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) {
            if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
              reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
            }
          }
          else {
            (*pXStack_18->m_skippedEntityHandler)(pXStack_18->m_handlerArg,_result->name,0);
          }
        }
        else {
          XVar5 = processInternalEntity(pXStack_18,_result,'\0');
          if (XVar5 != XML_ERROR_NONE) {
            return XVar5;
          }
          context._0_4_ = 0;
        }
      }
      else if (pXStack_18->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
        }
      }
      else {
        (*pXStack_18->m_characterDataHandler)
                  (pXStack_18->m_handlerArg,(XML_Char *)((long)&context + 7),1);
      }
      break;
    case 10:
      iStack_14c = (**(code **)(s_local + 0x48))(s_local,end_local);
      if (iStack_14c < 0) {
        return XML_ERROR_BAD_CHAR_REF;
      }
      if (pXStack_18->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
        }
      }
      else {
        p_Var3 = pXStack_18->m_characterDataHandler;
        pvVar4 = pXStack_18->m_handlerArg;
        iVar6 = XmlUtf8Encode(iStack_14c,(char *)&result_3);
        (*p_Var3)(pvVar4,(XML_Char *)&result_3,iVar6);
      }
      break;
    case 0xb:
      iVar6 = reportProcessingInstruction
                        (pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
      if (iVar6 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xc:
      return XML_ERROR_MISPLACED_XML_PI;
    case 0xd:
      iVar6 = reportComment(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
      if (iVar6 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xfffffffb:
      if (haveMore != '\0') {
        (dtd->generalEntities).v = (NAMED **)end_local;
        return XML_ERROR_NONE;
      }
      if (pXStack_18->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)nextPtr_local);
        }
      }
      else if (s_local[0x7c] == '\0') {
        charDataHandler = (XML_CharacterDataHandler)pXStack_18->m_dataBuf;
        (**(code **)(s_local + 0x68))
                  (s_local,&end_local,nextPtr_local,&charDataHandler,pXStack_18->m_dataBufEnd);
        (*pXStack_18->m_characterDataHandler)
                  (pXStack_18->m_handlerArg,pXStack_18->m_dataBuf,
                   (int)charDataHandler - (int)pXStack_18->m_dataBuf);
      }
      else {
        (*pXStack_18->m_characterDataHandler)
                  (pXStack_18->m_handlerArg,end_local,(int)nextPtr_local - (int)end_local);
      }
      if (enc_local._4_4_ == 0) {
        *eventEndPP = (char *)nextPtr_local;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (pXStack_18->m_tagLevel != enc_local._4_4_) {
        *eventEndPP = (char *)nextPtr_local;
        return XML_ERROR_ASYNC_ENTITY;
      }
      (dtd->generalEntities).v = (NAMED **)nextPtr_local;
      return XML_ERROR_NONE;
    case 0xfffffffc:
      if (haveMore != '\0') {
        (dtd->generalEntities).v = (NAMED **)end_local;
        return XML_ERROR_NONE;
      }
      if (0 < enc_local._4_4_) {
        if (pXStack_18->m_tagLevel != enc_local._4_4_) {
          return XML_ERROR_ASYNC_ENTITY;
        }
        (dtd->generalEntities).v = (NAMED **)end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case 0xfffffffd:
      if (haveMore != '\0') {
        (dtd->generalEntities).v = (NAMED **)end_local;
        return XML_ERROR_NONE;
      }
      *(char ***)next = nextPtr_local;
      if (pXStack_18->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)nextPtr_local);
        }
      }
      else {
        name._3_1_ = 10;
        (*pXStack_18->m_characterDataHandler)
                  (pXStack_18->m_handlerArg,(XML_Char *)((long)&name + 3),1);
      }
      if (enc_local._4_4_ == 0) {
        return XML_ERROR_NO_ELEMENTS;
      }
      if (pXStack_18->m_tagLevel != enc_local._4_4_) {
        return XML_ERROR_ASYNC_ENTITY;
      }
      (dtd->generalEntities).v = (NAMED **)nextPtr_local;
      return XML_ERROR_NONE;
    case 0xfffffffe:
      if (haveMore != '\0') {
        (dtd->generalEntities).v = (NAMED **)end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case 0xffffffff:
      if (haveMore != '\0') {
        (dtd->generalEntities).v = (NAMED **)end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    default:
      if (pXStack_18->m_defaultHandler != (XML_DefaultHandler)0x0) {
        reportDefault(pXStack_18,(ENCODING *)s_local,end_local,(char *)ppNStack_60);
      }
    }
    end_local = (char *)ppNStack_60;
    *eventEndPP = (char *)ppNStack_60;
    XVar1 = (pXStack_18->m_parsingStatus).parsing;
    if (XVar1 == XML_FINISHED) {
      return XML_ERROR_ABORTED;
    }
    if (XVar1 == XML_SUSPENDED) {
      (dtd->generalEntities).v = ppNStack_60;
      return XML_ERROR_NONE;
    }
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr,
          XML_Bool haveMore)
{
  /* save one level of indirection */
  DTD * const dtd = parser->m_dtd;

  const char **eventPP;
  const char **eventEndPP;
  if (enc == parser->m_encoding) {
    eventPP = &parser->m_eventPtr;
    eventEndPP = &parser->m_eventEndPtr;
  }
  else {
    eventPP = &(parser->m_openInternalEntities->internalEventPtr);
    eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;

  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (parser->m_tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (parser->m_tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (parser->m_characterDataHandler)
            parser->m_characterDataHandler(parser->m_handlerArg, &ch, 1);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd->pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&dtd->pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal,
           otherwise call the skipped entity or default handler.
        */
        if (!dtd->hasParamEntityRefs || dtd->standalone) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity->textPtr) {
          enum XML_Error result;
          if (!parser->m_defaultExpandInternalEntities) {
            if (parser->m_skippedEntityHandler)
              parser->m_skippedEntityHandler(parser->m_handlerArg, entity->name, 0);
            else if (parser->m_defaultHandler)
              reportDefault(parser, enc, s, next);
            break;
          }
          result = processInternalEntity(parser, entity, XML_FALSE);
          if (result != XML_ERROR_NONE)
            return result;
        }
        else if (parser->m_externalEntityRefHandler) {
          const XML_Char *context;
          entity->open = XML_TRUE;
          context = getContext(parser);
          entity->open = XML_FALSE;
          if (!context)
            return XML_ERROR_NO_MEMORY;
          if (!parser->m_externalEntityRefHandler(parser->m_externalEntityRefHandlerArg,
                                        context,
                                        entity->base,
                                        entity->systemId,
                                        entity->publicId))
            return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
          poolDiscard(&parser->m_tempPool);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        break;
      }
    case XML_TOK_START_TAG_NO_ATTS:
      /* fall through */
    case XML_TOK_START_TAG_WITH_ATTS:
      {
        TAG *tag;
        enum XML_Error result;
        XML_Char *toPtr;
        if (parser->m_freeTagList) {
          tag = parser->m_freeTagList;
          parser->m_freeTagList = parser->m_freeTagList->parent;
        }
        else {
          tag = (TAG *)MALLOC(parser, sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = (char *)MALLOC(parser, INIT_TAG_BUF_SIZE);
          if (!tag->buf) {
            FREE(parser, tag);
            return XML_ERROR_NO_MEMORY;
          }
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = NULL;
        tag->parent = parser->m_tagStack;
        parser->m_tagStack = tag;
        tag->name.localPart = NULL;
        tag->name.prefix = NULL;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        ++parser->m_tagLevel;
        {
          const char *rawNameEnd = tag->rawName + tag->rawNameLength;
          const char *fromPtr = tag->rawName;
          toPtr = (XML_Char *)tag->buf;
          for (;;) {
            int bufSize;
            int convLen;
            const enum XML_Convert_Result convert_res = XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            convLen = (int)(toPtr - (XML_Char *)tag->buf);
            if ((fromPtr >= rawNameEnd) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE)) {
              tag->name.strLen = convLen;
              break;
            }
            bufSize = (int)(tag->bufEnd - tag->buf) << 1;
            {
              char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
              if (temp == NULL)
                return XML_ERROR_NO_MEMORY;
              tag->buf = temp;
              tag->bufEnd = temp + bufSize;
              toPtr = (XML_Char *)temp + convLen;
            }
          }
        }
        tag->name.str = (XML_Char *)tag->buf;
        *toPtr = XML_T('\0');
        result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
        if (result)
          return result;
        if (parser->m_startElementHandler)
          parser->m_startElementHandler(parser->m_handlerArg, tag->name.str,
                              (const XML_Char **)parser->m_atts);
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = NULL;
        XML_Bool noElmHandlers = XML_TRUE;
        TAG_NAME name;
        name.str = poolStoreString(&parser->m_tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&parser->m_tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result != XML_ERROR_NONE) {
          freeBindings(parser, bindings);
          return result;
        }
        poolFinish(&parser->m_tempPool);
        if (parser->m_startElementHandler) {
          parser->m_startElementHandler(parser->m_handlerArg, name.str, (const XML_Char **)parser->m_atts);
          noElmHandlers = XML_FALSE;
        }
        if (parser->m_endElementHandler) {
          if (parser->m_startElementHandler)
            *eventPP = *eventEndPP;
          parser->m_endElementHandler(parser->m_handlerArg, name.str);
          noElmHandlers = XML_FALSE;
        }
        if (noElmHandlers && parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        freeBindings(parser, bindings);
      }
      if ((parser->m_tagLevel == 0) && (parser->m_parsingStatus.parsing != XML_FINISHED)) {
        if (parser->m_parsingStatus.parsing == XML_SUSPENDED)
          parser->m_processor = epilogProcessor;
        else
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_END_TAG:
      if (parser->m_tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = parser->m_tagStack;
        parser->m_tagStack = tag->parent;
        tag->parent = parser->m_freeTagList;
        parser->m_freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --parser->m_tagLevel;
        if (parser->m_endElementHandler) {
          const XML_Char *localPart;
          const XML_Char *prefix;
          XML_Char *uri;
          localPart = tag->name.localPart;
          if (parser->m_ns && localPart) {
            /* localPart and prefix may have been overwritten in
               tag->name.str, since this points to the binding->uri
               buffer which gets re-used; so we have to add them again
            */
            uri = (XML_Char *)tag->name.str + tag->name.uriLen;
            /* don't need to check for space - already done in storeAtts() */
            while (*localPart) *uri++ = *localPart++;
            prefix = (XML_Char *)tag->name.prefix;
            if (parser->m_ns_triplets && prefix) {
              *uri++ = parser->m_namespaceSeparator;
              while (*prefix) *uri++ = *prefix++;
             }
            *uri = XML_T('\0');
          }
          parser->m_endElementHandler(parser->m_handlerArg, tag->name.str);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (parser->m_endNamespaceDeclHandler)
            parser->m_endNamespaceDeclHandler(parser->m_handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = parser->m_freeBindingList;
          parser->m_freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (parser->m_tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (parser->m_characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          parser->m_characterDataHandler(parser->m_handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (parser->m_startCdataSectionHandler)
          parser->m_startCdataSectionHandler(parser->m_handlerArg);
/* BEGIN disabled code */
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the
           transformation and writes the characters out escaping them as
           necessary.  This case will fail to work if we leave out the
           following two lines (because & and < inside CDATA sections will
           be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this.
        */
        else if (0 && parser->m_characterDataHandler)
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf, 0);
/* END disabled code */
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr, haveMore);
        if (result != XML_ERROR_NONE)
          return result;
        else if (!next) {
          parser->m_processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (parser->m_characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                               (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
        }
        else
          parser->m_characterDataHandler(parser->m_handlerArg,
                               (XML_Char *)s,
                               (int)((XML_Char *)end - (XML_Char *)s));
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (parser->m_tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      {
        XML_CharacterDataHandler charDataHandler = parser->m_characterDataHandler;
        if (charDataHandler) {
          if (MUST_CONVERT(enc, s)) {
            for (;;) {
              ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
              const enum XML_Convert_Result convert_res = XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
              *eventEndPP = s;
              charDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                              (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
              if ((convert_res == XML_CONVERT_COMPLETED) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
                break;
              *eventPP = s;
            }
          }
          else
            charDataHandler(parser->m_handlerArg,
                            (XML_Char *)s,
                            (int)((XML_Char *)next - (XML_Char *)s));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      /* All of the tokens produced by XmlContentTok() have their own
       * explicit cases, so this default is not strictly necessary.
       * However it is a useful safety net, so we retain the code and
       * simply exclude it from the coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
      /* LCOV_EXCL_STOP */
    }
    *eventPP = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
  /* not reached */
}